

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HSet.cpp
# Opt level: O3

bool __thiscall
HSet::setup(HSet *this,HighsInt size,HighsInt max_entry,bool output_flag,FILE *log_file,bool debug,
           bool allow_assert)

{
  this->setup_ = false;
  if (-1 < max_entry && 0 < size) {
    this->max_entry_ = max_entry;
    this->debug_ = debug;
    this->allow_assert_ = allow_assert;
    this->output_flag_ = output_flag;
    this->log_file_ = log_file;
    std::vector<int,_std::allocator<int>_>::resize(&this->entry_,(ulong)(uint)size);
    std::vector<int,_std::allocator<int>_>::_M_fill_assign
              (&this->pointer_,(long)this->max_entry_ + 1,&no_pointer);
    this->count_ = 0;
    this->setup_ = true;
  }
  return -1 < max_entry && 0 < size;
}

Assistant:

bool HSet::setup(const HighsInt size, const HighsInt max_entry,
                 const bool output_flag, FILE* log_file, const bool debug,
                 const bool allow_assert) {
  setup_ = false;
  if (size <= 0) return false;
  if (max_entry < min_entry) return false;
  max_entry_ = max_entry;
  debug_ = debug;
  allow_assert_ = allow_assert;
  output_flag_ = output_flag;
  log_file_ = log_file;
  entry_.resize(size);
  pointer_.assign(max_entry_ + 1, no_pointer);
  count_ = 0;
  setup_ = true;
  return true;
}